

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void mqc_renorme(opj_mqc_t *mqc)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  
  do {
    uVar2 = mqc->c;
    uVar3 = mqc->a;
    mqc->c = uVar2 * 2;
    mqc->a = uVar3 * 2;
    puVar1 = &mqc->ct;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      mqc_byteout(mqc);
    }
  } while ((mqc->a & 0x8000) == 0);
  return;
}

Assistant:

static void mqc_renorme(opj_mqc_t *mqc) {
	do {
		mqc->a <<= 1;
		mqc->c <<= 1;
		mqc->ct--;
		if (mqc->ct == 0) {
			mqc_byteout(mqc);
		}
	} while ((mqc->a & 0x8000) == 0);
}